

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_file_sink-inl.h
# Opt level: O0

void __thiscall
spdlog::sinks::rotating_file_sink<std::mutex>::rotate_(rotating_file_sink<std::mutex> *this)

{
  bool bVar1;
  int in_ESI;
  rotating_file_sink<std::mutex> *in_RDI;
  filename_t target;
  filename_t src;
  size_t i;
  undefined6 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  string *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  file_helper *in_stack_ffffffffffffff30;
  filename_t *in_stack_ffffffffffffff70;
  string local_58 [32];
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  filename_t *in_stack_ffffffffffffffd0;
  size_t local_10;
  
  details::file_helper::close(&in_RDI->file_helper_,in_ESI);
  local_10 = in_RDI->max_files_;
  do {
    if (local_10 == 0) {
      details::file_helper::reopen(in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f);
      return;
    }
    calc_filename(in_stack_ffffffffffffffd0,
                  CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    bVar1 = details::os::path_exists(in_stack_ffffffffffffff70);
    if (bVar1) {
      calc_filename(in_stack_ffffffffffffffd0,
                    CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      in_stack_fffffffffffffeef =
           rename_file_(in_RDI,(filename_t *)
                               CONCAT17(in_stack_fffffffffffffeef,
                                        CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8
                                                )),(filename_t *)0x239ea2);
      if (!(bool)in_stack_fffffffffffffeef) {
        details::os::sleep_for_millis((uint)((ulong)in_RDI >> 0x20));
        in_stack_fffffffffffffeee =
             rename_file_(in_RDI,(filename_t *)
                                 CONCAT17(in_stack_fffffffffffffeef,
                                          CONCAT16(in_stack_fffffffffffffeee,
                                                   in_stack_fffffffffffffee8)),
                          (filename_t *)0x239eda);
        if (!(bool)in_stack_fffffffffffffeee) {
          details::file_helper::reopen(in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f);
          in_RDI->current_size_ = 0;
          details::os::filename_to_str
                    ((filename_t *)
                     CONCAT17(in_stack_fffffffffffffeef,
                              CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)));
          std::operator+((char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI
                        );
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                         (char *)in_RDI);
          details::os::filename_to_str
                    ((filename_t *)
                     CONCAT17(in_stack_fffffffffffffeef,
                              CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8)));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                         in_stack_ffffffffffffff20);
          __errno_location();
          throw_spdlog_ex(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
        }
      }
      std::__cxx11::string::~string(local_58);
      in_stack_ffffffffffffffcc = 0;
    }
    else {
      in_stack_ffffffffffffffcc = 4;
    }
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
    local_10 = local_10 - 1;
  } while( true );
}

Assistant:

SPDLOG_INLINE void rotating_file_sink<Mutex>::rotate_()
{
    using details::os::filename_to_str;
    using details::os::path_exists;

    file_helper_.close();
    for (auto i = max_files_; i > 0; --i)
    {
        filename_t src = calc_filename(base_filename_, i - 1);
        if (!path_exists(src))
        {
            continue;
        }
        filename_t target = calc_filename(base_filename_, i);

        if (!rename_file_(src, target))
        {
            // if failed try again after a small delay.
            // this is a workaround to a windows issue, where very high rotation
            // rates can cause the rename to fail with permission denied (because of antivirus?).
            details::os::sleep_for_millis(100);
            if (!rename_file_(src, target))
            {
                file_helper_.reopen(true); // truncate the log file anyway to prevent it to grow beyond its limit!
                current_size_ = 0;
                throw_spdlog_ex("rotating_file_sink: failed renaming " + filename_to_str(src) + " to " + filename_to_str(target), errno);
            }
        }
    }
    file_helper_.reopen(true);
}